

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeConditional(ExpressionContext *ctx,SynConditional *syntax)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ExprBase *pEVar5;
  SynBase *expr;
  TypeUnsizedArray *pTVar6;
  ExprBase *pEVar7;
  TypeUnsizedArray *pTVar8;
  undefined4 extraout_var_00;
  ScopeData *pSVar9;
  TypeUnsizedArray *type;
  SynBase *source;
  ScopeData *target;
  ExprBase *local_50;
  undefined4 extraout_var;
  
  pEVar5 = AnalyzeExpression(ctx,syntax->condition);
  pEVar5 = CreateConditionCast(ctx,pEVar5->source,pEVar5);
  AssertValueExpression(ctx,&syntax->super_SynBase,pEVar5);
  local_50 = AnalyzeStatement(ctx,syntax->trueBlock);
  expr = (SynBase *)AnalyzeStatement(ctx,syntax->falseBlock);
  if ((((pEVar5->type != (TypeBase *)0x0) && (pEVar5->type->typeID == 0)) ||
      ((local_50->type != (TypeBase *)0x0 && (local_50->type->typeID == 0)))) ||
     (((((TypeBase *)expr->end != (TypeBase *)0x0 && (((TypeBase *)expr->end)->typeID == 0)) ||
       (bVar3 = AssertValueExpression(ctx,&syntax->super_SynBase,local_50), !bVar3)) ||
      (bVar3 = AssertValueExpression(ctx,&syntax->super_SynBase,(ExprBase *)expr), !bVar3)))) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar8 = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    goto LAB_00152d4e;
  }
  type = (TypeUnsizedArray *)expr->end;
  if ((TypeUnsizedArray *)local_50->type != type) {
    pTVar8 = (TypeUnsizedArray *)ctx->typeNullPtr;
    if ((TypeUnsizedArray *)local_50->type == pTVar8) {
      local_50 = CreateCast(ctx,syntax->trueBlock,local_50,(TypeBase *)type,false);
      type = (TypeUnsizedArray *)expr->end;
      pTVar8 = (TypeUnsizedArray *)ctx->typeNullPtr;
    }
    if (type == pTVar8) {
      expr = (SynBase *)CreateCast(ctx,syntax->falseBlock,(ExprBase *)expr,local_50->type,false);
      type = (TypeUnsizedArray *)expr->end;
    }
  }
  pTVar8 = (TypeUnsizedArray *)local_50->type;
  if (pTVar8 != type) {
    bVar3 = ExpressionContext::IsNumericType(ctx,(TypeBase *)pTVar8);
    if ((bVar3) && (bVar3 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type), bVar3)) {
      pTVar6 = (TypeUnsizedArray *)
               ExpressionContext::GetBinaryOpResultType(ctx,(TypeBase *)pTVar8,(TypeBase *)type);
LAB_00152ee9:
      local_50 = CreateCast(ctx,syntax->trueBlock,local_50,(TypeBase *)pTVar6,false);
      source = syntax->falseBlock;
    }
    else {
      if ((pTVar8 == (TypeUnsizedArray *)0x0) ||
         (pTVar6 = pTVar8, (pTVar8->super_TypeStruct).super_TypeBase.typeID != 0x13)) {
        pTVar6 = (TypeUnsizedArray *)0x0;
      }
      if (((type != (TypeUnsizedArray *)0x0) && (pTVar6 != (TypeUnsizedArray *)0x0)) &&
         (((type->super_TypeStruct).super_TypeBase.typeID == 0x13 &&
          (pSVar9 = (pTVar6->super_TypeStruct).typeScope,
          pSVar9 == (type->super_TypeStruct).typeScope)))) {
        pTVar6 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pSVar9);
        goto LAB_00152ee9;
      }
      if ((pTVar8 == (TypeUnsizedArray *)0x0) ||
         (pTVar6 = pTVar8, (pTVar8->super_TypeStruct).super_TypeBase.typeID != 0x12)) {
        pTVar6 = (TypeUnsizedArray *)0x0;
      }
      if (((type == (TypeUnsizedArray *)0x0) || (pTVar6 == (TypeUnsizedArray *)0x0)) ||
         ((type->super_TypeStruct).super_TypeBase.typeID != 0x12)) {
LAB_00152ea4:
        pcVar1 = (pTVar8->super_TypeStruct).super_TypeBase.name.begin;
        pcVar2 = (type->super_TypeStruct).super_TypeBase.name.begin;
        anon_unknown.dwarf_94284::Report
                  (ctx,&syntax->super_SynBase,
                   "ERROR: can\'t find common type between \'%.*s\' and \'%.*s\'",
                   (ulong)(uint)(*(int *)&(pTVar8->super_TypeStruct).super_TypeBase.name.end -
                                (int)pcVar1),pcVar1,
                   (ulong)(uint)(*(int *)&(type->super_TypeStruct).super_TypeBase.name.end -
                                (int)pcVar2),pcVar2);
        pTVar8 = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
        goto LAB_00152f1e;
      }
      pSVar9 = (pTVar6->super_TypeStruct).typeScope;
      if ((pSVar9 == (ScopeData *)0x0) || (pSVar9->uniqueId != 0x18)) {
        pSVar9 = (ScopeData *)0x0;
      }
      target = (type->super_TypeStruct).typeScope;
      if ((target == (ScopeData *)0x0) || (target->uniqueId != 0x18)) {
        target = (ScopeData *)0x0;
      }
      bVar3 = anon_unknown.dwarf_94284::IsDerivedFrom((TypeClass *)pSVar9,(TypeClass *)target);
      if (bVar3) {
        local_50 = CreateCast(ctx,syntax->trueBlock,local_50,(TypeBase *)type,false);
        pTVar8 = type;
        goto LAB_00152f1e;
      }
      bVar3 = anon_unknown.dwarf_94284::IsDerivedFrom((TypeClass *)target,(TypeClass *)pSVar9);
      if (!bVar3) goto LAB_00152ea4;
      source = syntax->falseBlock;
    }
    expr = (SynBase *)CreateCast(ctx,source,(ExprBase *)expr,(TypeBase *)pTVar6,false);
    pTVar8 = pTVar6;
  }
LAB_00152f1e:
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
LAB_00152d4e:
  pEVar7->typeID = 0x18;
  pEVar7->source = &syntax->super_SynBase;
  pEVar7->type = (TypeBase *)pTVar8;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223da0;
  pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar5;
  *(ExprBase **)&pEVar7[1].typeID = local_50;
  pEVar7[1].source = expr;
  return pEVar7;
}

Assistant:

ExprBase* AnalyzeConditional(ExpressionContext &ctx, SynConditional *syntax)
{
	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	AssertValueExpression(ctx, syntax, condition);

	ExprBase *trueBlock = AnalyzeStatement(ctx, syntax->trueBlock);
	ExprBase *falseBlock = AnalyzeStatement(ctx, syntax->falseBlock);

	if(isType<TypeError>(condition->type) || isType<TypeError>(trueBlock->type) || isType<TypeError>(falseBlock->type))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	if(!AssertValueExpression(ctx, syntax, trueBlock))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	if(!AssertValueExpression(ctx, syntax, falseBlock))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	// Handle null pointer promotion
	if(trueBlock->type != falseBlock->type)
	{
		if(trueBlock->type == ctx.typeNullPtr)
			trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, falseBlock->type, false);

		if(falseBlock->type == ctx.typeNullPtr)
			falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, trueBlock->type, false);
	}

	TypeBase *resultType = NULL;

	if(trueBlock->type == falseBlock->type)
	{
		resultType = trueBlock->type;
	}
	else if(ctx.IsNumericType(trueBlock->type) && ctx.IsNumericType(falseBlock->type))
	{
		resultType = ctx.GetBinaryOpResultType(trueBlock->type, falseBlock->type);

		trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
		falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
	}
	else
	{
		TypeArray *trueBlockTypeArray = getType<TypeArray>(trueBlock->type);
		TypeArray *falseBlockTypeArray = getType<TypeArray>(falseBlock->type);

		if(trueBlockTypeArray && falseBlockTypeArray && trueBlockTypeArray->subType == falseBlockTypeArray->subType)
		{
			resultType = ctx.GetUnsizedArrayType(trueBlockTypeArray->subType);

			trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
			falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
		}
		else
		{
			TypeRef *trueBlockTypeRef = getType<TypeRef>(trueBlock->type);
			TypeRef *falseBlockTypeRef = getType<TypeRef>(falseBlock->type);

			if(trueBlockTypeRef && falseBlockTypeRef)
			{
				TypeClass *trueBlockTypeClass = getType<TypeClass>(trueBlockTypeRef->subType);
				TypeClass *falseBlockTypeClass = getType<TypeClass>(falseBlockTypeRef->subType);

				if(IsDerivedFrom(trueBlockTypeClass, falseBlockTypeClass))
				{
					resultType = falseBlockTypeRef;

					trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
				}
				else if(IsDerivedFrom(falseBlockTypeClass, trueBlockTypeClass))
				{
					resultType = trueBlockTypeRef;

					falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
				}
			}

			if(!resultType)
			{
				Report(ctx, syntax, "ERROR: can't find common type between '%.*s' and '%.*s'", FMT_ISTR(trueBlock->type->name), FMT_ISTR(falseBlock->type->name));

				resultType = ctx.GetErrorType();
			}
		}
	}

	return new (ctx.get<ExprConditional>()) ExprConditional(syntax, resultType, condition, trueBlock, falseBlock);
}